

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_move_scalar_from_top(Parser *this)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  State *pSVar4;
  code *pcVar5;
  size_t sVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  State *pSVar10;
  char msg [42];
  char local_58 [56];
  
  uVar3 = (this->m_stack).m_size;
  if (1 < uVar3) {
    pSVar4 = (this->m_stack).m_stack;
    pSVar10 = this->m_state;
    if (pSVar10 != pSVar4 + (uVar3 - 1)) {
      builtin_strncpy(local_58 + 0x20,"ck.top())",10);
      builtin_strncpy(local_58 + 0x10,"_state == &m_sta",0x10);
      builtin_strncpy(local_58,"check failed: (m",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7941) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x7941) << 0x40,8);
      LVar7.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar7.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_58,0x2a,LVar7,(this->m_stack).m_callbacks.m_user_data);
      pSVar10 = this->m_state;
    }
    if (pSVar10 == pSVar4 + (uVar3 - 2)) {
      builtin_strncpy(local_58 + 0x10,"_state != &prev)",0x11);
      builtin_strncpy(local_58,"check failed: (m",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7942) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x7942) << 0x40,8);
      LVar8.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar8.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_58,0x21,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
    uVar2 = pSVar4[uVar3 - 2].flags;
    if ((uVar2 >> 9 & 1) != 0) {
      pSVar10 = this->m_state;
      pSVar10->flags = pSVar10->flags | uVar2 & 0x600;
      sVar6 = pSVar4[uVar3 - 2].scalar.len;
      (pSVar10->scalar).str = pSVar4[uVar3 - 2].scalar.str;
      (pSVar10->scalar).len = sVar6;
      pbVar1 = (byte *)((long)&pSVar4[uVar3 - 2].flags + 1);
      *pbVar1 = *pbVar1 & 0xf9;
      pSVar4[uVar3 - 2].scalar.str = (char *)0x0;
      pSVar4[uVar3 - 2].scalar.len = 0;
    }
  }
  return;
}

Assistant:

size_t size() const { return m_size; }